

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
optTyped_moveAssignmentNotEmptyForNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
::~optTyped_moveAssignmentNotEmptyForNotEmpty_Test
          (optTyped_moveAssignmentNotEmptyForNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TYPED_TEST(optTyped, moveAssignmentNotEmptyForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1{this->value_1};
  opt_type o2{this->value_2};
  o2 = std::move(o1);
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}